

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingTesselationEvaluationShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_tesselation_evaluation_shader_code)

{
  samplingFunction sampling_function_00;
  samplerType sVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  attributeDefinition *paVar7;
  ostream *poVar8;
  size_t sVar9;
  long *plVar10;
  GLuint n_components;
  char *attribute_name_prefix;
  char *color_type;
  char *pcVar11;
  int iVar12;
  bool bVar13;
  attributeDefinition *paVar14;
  long lVar15;
  bool *local_228;
  string sampling_code;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  sampling_code._M_dataplus._M_p = (pointer)&sampling_code.field_2;
  sampling_code._M_string_length = 0;
  sampling_code.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  uVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  attribute_name_prefix = "vs_out_";
  if ((uVar6 & 0x300) == 0) {
    attribute_name_prefix = "tcs_out_";
  }
  sampling_function_00 = *sampling_function;
  color_type = (char *)0x0;
  switch(sampling_function_00) {
  case Texture:
    paVar14 = getAttributes::texture_attributes;
    goto LAB_00d78b78;
  case TextureLod:
    paVar14 = getAttributes::textureLod_attributes;
    iVar12 = 2;
    break;
  case TextureGrad:
    paVar14 = getAttributes::textureGrad_attributes;
    iVar12 = 3;
    break;
  case TextureGather:
    paVar14 = getAttributes::textureGather_attributes;
LAB_00d78b78:
    iVar12 = 1;
    break;
  default:
    bVar13 = false;
    iVar12 = 0;
    paVar14 = (attributeDefinition *)0x0;
    goto LAB_00d78b8e;
  }
  bVar13 = true;
LAB_00d78b8e:
  sVar1 = *sampler_type;
  paVar7 = getAttributes::depth_attributes;
  if (sVar1 != Depth) {
    paVar7 = (attributeDefinition *)color_type;
  }
  bVar5 = true;
  bVar4 = true;
  switch(sVar1) {
  case Float:
    pcVar11 = "samplerCubeArray ";
    n_components = 4;
    local_228 = fixed_sample_locations_values + 1;
    color_type = "vec4 ";
    bVar4 = bVar5;
    break;
  case Int:
    pcVar11 = "isamplerCubeArray ";
    n_components = 4;
    local_228 = (bool *)0x1b77351;
    color_type = "ivec4 ";
    bVar4 = bVar5;
    break;
  case UInt:
    pcVar11 = "usamplerCubeArray ";
    n_components = 4;
    local_228 = (bool *)0x1b77351;
    color_type = "uvec4 ";
    bVar4 = bVar5;
    break;
  case Depth:
    pcVar11 = "samplerCubeArrayShadow ";
    n_components = 1;
    local_228 = fixed_sample_locations_values + 1;
    color_type = "float ";
    bVar4 = false;
    break;
  case Stencil:
    pcVar11 = "usamplerCubeArray ";
    n_components = 1;
    local_228 = (bool *)0x1b77351;
    color_type = "uint ";
    bVar4 = bVar5;
    break;
  default:
    local_228 = (bool *)0x0;
    n_components = 0;
    bVar5 = true;
    pcVar11 = (char *)0x0;
    goto LAB_00d78c7f;
  }
  bVar5 = false;
LAB_00d78c7f:
  if (bVar4) {
    getSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x1a9f87f,sampling_function_00,color_type,
               n_components,attribute_name_prefix,"0","fs_in_color",(GLchar *)0x0,"sampler",
               &sampling_code);
  }
  else {
    getShadowSamplingFunctionCall
              ((TextureCubeMapArraySamplingTest *)0x1a9f87f,sampling_function_00,color_type,
               n_components,attribute_name_prefix,"0","fs_in_color",(GLchar *)0x0,"sampler",
               &sampling_code);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"${TESSELLATION_SHADER_REQUIRE}\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision highp float;\n",0x17);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  poVar8 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"/* Sampling tesselation evaluation shader */",0x2c);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(isolines, point_mode) in;\n\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"highp ",6);
  iVar3 = (int)(ostream *)local_1a8;
  if (bVar5) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar9 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sampler",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (bVar13) {
    lVar15 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar11 = *(char **)((long)&paVar14->type + lVar15);
      if (pcVar11 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar9 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,attribute_name_prefix,(ulong)((uVar6 & 0x300) == 0) + 7);
      pcVar11 = *(char **)((long)&paVar14->name + lVar15);
      if (pcVar11 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar9 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[];",3);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar15 = lVar15 + 0x18;
    } while ((ulong)((iVar12 + (uint)(iVar12 == 0)) * 8) * 3 != lVar15);
  }
  if (sVar1 == Depth) {
    bVar13 = true;
    lVar15 = 0;
    while (bVar13) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
      pcVar11 = paVar7[lVar15].type;
      if (pcVar11 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar9 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,attribute_name_prefix,(ulong)((uVar6 & 0x300) == 0) + 7);
      pcVar11 = paVar7[lVar15].name;
      if (pcVar11 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar9 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[];",3);
      std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      lVar15 = 1;
      bVar13 = false;
      std::ostream::flush();
    }
  }
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (bVar5) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar9 = strlen(local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_228,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out ",4);
  if (bVar5) {
    std::ios::clear(iVar3 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar9 = strlen(color_type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,color_type,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"fs_in_color",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main()\n{\n    gl_Position = gl_in[0].gl_Position;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,sampling_code._M_dataplus._M_p,sampling_code._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  plVar10 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)out_tesselation_evaluation_shader_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sampling_code._M_dataplus._M_p != &sampling_code.field_2) {
    operator_delete(sampling_code._M_dataplus._M_p,
                    CONCAT71(sampling_code.field_2._M_allocated_capacity._1_7_,
                             sampling_code.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingTesselationEvaluationShaderCode(
	const samplerType& sampler_type, const samplingFunction& sampling_function,
	std::string& out_tesselation_evaluation_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;
	const glw::GLchar*		   prev_stage_output = (glu::isContextTypeES(m_context.getRenderContext().getType())) ?
											   tesselation_control_shader_output :
											   vertex_shader_output;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, prev_stage_output, "0",
								fragment_shader_input, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, prev_stage_output, "0",
									  fragment_shader_input, 0, sampler_name, sampling_code);
	}

	/* Preamble, extension : require */
	stream << shader_code_preamble << tesselation_shader_extension << shader_precision << std::endl
		   << "/* Sampling tesselation evaluation shader */" << std::endl;

	/* layout(point_mode) in; */
	stream << tesselation_evaluation_shader_layout;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	stream << std::endl;

	/* in type attribute[]*/
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << shader_input << routine_attribute_definitions[i].type << prev_stage_output
			   << routine_attribute_definitions[i].name << "[];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << shader_input << type_attribute_definitions[i].type << prev_stage_output
			   << type_attribute_definitions[i].name << "[];" << std::endl;
	}

	stream << std::endl;

	/* out vec4 tes_in_color */
	stream << interpolation_type << shader_output << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << tesselation_evaluation_shader_sampling_body_code;

	/* Sampling code */
	stream << sampling_code;

	stream << "}" << std::endl << std::endl;

	/* Store result */
	out_tesselation_evaluation_shader_code = stream.str();
}